

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QString * __thiscall
QHash<ReplaceExtraCompilerCacheKey,_QString>::value
          (QHash<ReplaceExtraCompilerCacheKey,_QString> *this,ReplaceExtraCompilerCacheKey *key)

{
  QString *pQVar1;
  QString *in_RDI;
  QString *v;
  QString *in_stack_ffffffffffffffc8;
  QString *pQVar2;
  
  pQVar2 = in_RDI;
  pQVar1 = valueImpl<ReplaceExtraCompilerCacheKey>
                     ((QHash<ReplaceExtraCompilerCacheKey,_QString> *)in_RDI,
                      (ReplaceExtraCompilerCacheKey *)in_RDI);
  if (pQVar1 == (QString *)0x0) {
    QString::QString((QString *)0x18fcab);
  }
  else {
    QString::QString(in_RDI,in_stack_ffffffffffffffc8);
  }
  return pQVar2;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }